

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void ot::commissioner::from_json(Json *aJson,ActiveOperationalDataset *aDataset)

{
  byte *pbVar1;
  undefined4 uVar2;
  bool bVar3;
  Channel CVar4;
  const_reference pvVar5;
  Timestamp TVar6;
  JsonException *pJVar7;
  allocator local_e9;
  undefined1 local_e8 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  string prefix;
  Error local_a0;
  Error local_78;
  Error local_50;
  
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[16],_0>(aJson,(char (*) [16])"ActiveTimestamp");
  if (bVar3) {
    std::__cxx11::string::string((string *)local_e8,"ActiveTimestamp",(allocator *)&prefix);
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_e8);
    TVar6 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<ot::commissioner::Timestamp,_ot::commissioner::Timestamp,_0>(pvVar5);
    aDataset->mActiveTimestamp = TVar6;
    std::__cxx11::string::~string((string *)local_e8);
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[12],_0>(aJson,(char (*) [12])"NetworkName");
  if (bVar3) {
    std::__cxx11::string::string((string *)&prefix,"NetworkName",&local_e9);
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&prefix);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,pvVar5)
    ;
    std::__cxx11::string::operator=((string *)&aDataset->mNetworkName,(string *)local_e8);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)&prefix);
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[8],_0>(aJson,(char (*) [8])"Channel");
  if (bVar3) {
    std::__cxx11::string::string((string *)local_e8,"Channel",(allocator *)&prefix);
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_e8);
    CVar4 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<ot::commissioner::Channel,_ot::commissioner::Channel,_0>(pvVar5);
    aDataset->mChannel = CVar4;
    std::__cxx11::string::~string((string *)local_e8);
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x40;
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[12],_0>(aJson,(char (*) [12])"ChannelMask");
  if (bVar3) {
    std::__cxx11::string::string((string *)local_e8,"ChannelMask",&local_e9);
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_e8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>,_std::vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>,_0>
              ((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
                *)&prefix,pvVar5);
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::_M_move_assign(&aDataset->mChannelMask,&prefix);
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
               *)&prefix);
    std::__cxx11::string::~string((string *)local_e8);
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[14],_0>(aJson,(char (*) [14])"ExtendedPanId");
  if (bVar3) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)aJson,"ExtendedPanId");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&prefix,pvVar5);
    utils::Hex((Error *)local_e8,&aDataset->mExtendedPanId,&prefix);
    uVar2 = local_e8._0_4_;
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&prefix);
    if (uVar2 != kNone) {
      pJVar7 = (JsonException *)__cxa_allocate_exception(0x38);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)aJson,"ExtendedPanId");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 pvVar5);
      utils::Hex(&local_50,&aDataset->mExtendedPanId,(string *)local_e8);
      JsonException::JsonException(pJVar7,&local_50);
      __cxa_throw(pJVar7,&JsonException::typeinfo,JsonException::~JsonException);
    }
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[6],_0>(aJson,(char (*) [6])0x1f3573);
  if (bVar3) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)aJson,"PanId");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&prefix,pvVar5);
    utils::ParseInteger<unsigned_short>((Error *)local_e8,&aDataset->mPanId,&prefix);
    uVar2 = local_e8._0_4_;
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&prefix);
    if (uVar2 != kNone) {
      pJVar7 = (JsonException *)__cxa_allocate_exception(0x38);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)aJson,"PanId");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                 pvVar5);
      utils::ParseInteger<unsigned_short>(&local_78,&aDataset->mPanId,(string *)local_e8);
      JsonException::JsonException(pJVar7,&local_78);
      __cxa_throw(pJVar7,&JsonException::typeinfo,JsonException::~JsonException);
    }
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[16],_0>(aJson,(char (*) [16])"MeshLocalPrefix");
  if (bVar3) {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)aJson,"MeshLocalPrefix");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&prefix,pvVar5);
    Ipv6PrefixFromString((Error *)local_e8,&aDataset->mMeshLocalPrefix,&prefix);
    std::__cxx11::string::~string((string *)&local_e0);
    if (local_e8._0_4_ != kNone) {
      pJVar7 = (JsonException *)__cxa_allocate_exception(0x38);
      Ipv6PrefixFromString(&local_a0,&aDataset->mMeshLocalPrefix,&prefix);
      JsonException::JsonException(pJVar7,&local_a0);
      __cxa_throw(pJVar7,&JsonException::typeinfo,JsonException::~JsonException);
    }
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 8;
    std::__cxx11::string::~string((string *)&prefix);
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[17],_0>(aJson,(char (*) [17])"NetworkMasterKey");
  if (bVar3) {
    std::__cxx11::string::string((string *)local_e8,"NetworkMasterKey",&local_e9);
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_e8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_0>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&prefix,pvVar5);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&aDataset->mNetworkMasterKey,&prefix);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&prefix);
    std::__cxx11::string::~string((string *)local_e8);
    pbVar1 = (byte *)((long)&aDataset->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 4;
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[5],_0>(aJson,(char (*) [5])"PSKc");
  if (bVar3) {
    std::__cxx11::string::string((string *)local_e8,"PSKc",&local_e9);
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,(key_type *)local_e8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_0>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&prefix,pvVar5);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&aDataset->mPSKc,&prefix);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&prefix);
    std::__cxx11::string::~string((string *)local_e8);
    *(byte *)&aDataset->mPresentFlags = (byte)aDataset->mPresentFlags | 0x80;
  }
  bVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[15],_0>(aJson,(char (*) [15])"SecurityPolicy");
  if (bVar3) {
    std::__cxx11::string::string((string *)&prefix,"SecurityPolicy",&local_e9);
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::at(aJson,&prefix);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<ot::commissioner::SecurityPolicy,_ot::commissioner::SecurityPolicy,_0>
              ((SecurityPolicy *)local_e8,pvVar5);
    SecurityPolicy::operator=(&aDataset->mSecurityPolicy,(SecurityPolicy *)local_e8);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e0);
    std::__cxx11::string::~string((string *)&prefix);
    *(byte *)&aDataset->mPresentFlags = (byte)aDataset->mPresentFlags | 0x40;
  }
  return;
}

Assistant:

static void from_json(const Json &aJson, ActiveOperationalDataset &aDataset)
{
#define SET_IF_PRESENT(name)                                                  \
    if (aJson.contains(#name))                                                \
    {                                                                         \
        aDataset.m##name = aJson.at(#name).get<decltype(aDataset.m##name)>(); \
        aDataset.mPresentFlags |= ActiveOperationalDataset::k##name##Bit;     \
    };

    SET_IF_PRESENT(ActiveTimestamp);
    SET_IF_PRESENT(NetworkName);
    SET_IF_PRESENT(Channel);
    SET_IF_PRESENT(ChannelMask);

    if (aJson.contains("ExtendedPanId"))
    {
        SuccessOrThrow(utils::Hex(aDataset.mExtendedPanId, aJson["ExtendedPanId"]));
        aDataset.mPresentFlags |= ActiveOperationalDataset::kExtendedPanIdBit;
    }

    if (aJson.contains("PanId"))
    {
        SuccessOrThrow(utils::ParseInteger(aDataset.mPanId, aJson["PanId"]));
        aDataset.mPresentFlags |= ActiveOperationalDataset::kPanIdBit;
    }

    if (aJson.contains("MeshLocalPrefix"))
    {
        std::string prefix = aJson["MeshLocalPrefix"];

        SuccessOrThrow(Ipv6PrefixFromString(aDataset.mMeshLocalPrefix, prefix));
        aDataset.mPresentFlags |= ActiveOperationalDataset::kMeshLocalPrefixBit;
    };

    SET_IF_PRESENT(NetworkMasterKey);
    SET_IF_PRESENT(PSKc);
    SET_IF_PRESENT(SecurityPolicy);

#undef SET_IF_PRESENT
}